

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O3

size_t __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_length(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  size_t *psVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  ushort uVar5;
  uint uVar6;
  ubjson_errc __e;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  uint8_t type;
  uint8_t buf [1];
  byte local_11 [3];
  ushort uStack_e;
  uint uStack_c;
  
  pbVar10 = (this->source_).current_._M_current;
  pbVar3 = (this->source_).end_._M_current;
  uVar8 = (ulong)(pbVar3 != pbVar10);
  if (pbVar3 == pbVar10) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar8;
  }
  else {
    pbVar2 = pbVar10 + uVar8;
    uVar11 = 0;
    pbVar4 = pbVar10;
    do {
      (this->source_).current_._M_current = pbVar4 + 1;
      local_11[uVar11] = *pbVar4;
      uVar11 = uVar11 + 1;
      pbVar4 = pbVar4 + 1;
    } while (uVar8 != uVar11);
    sVar7 = (this->source_).position_ + uVar8;
    (this->source_).position_ = sVar7;
    if (local_11[0] < 0x55) {
      if (local_11[0] == 0x49) {
        uVar11 = 2;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 2) {
          uVar11 = (long)pbVar3 - (long)pbVar2;
        }
        if (pbVar3 == pbVar2) {
LAB_007a20c2:
          (this->source_).position_ = uVar11 + sVar7;
          goto LAB_007a20ef;
        }
        uVar9 = 0;
        pbVar10 = pbVar10 + uVar8;
        do {
          (this->source_).current_._M_current = pbVar10 + 1;
          local_11[uVar9 + 1] = *pbVar10;
          uVar9 = uVar9 + 1;
          pbVar10 = pbVar10 + 1;
        } while (uVar11 != uVar9);
        (this->source_).position_ = uVar11 + sVar7;
        __e = unexpected_eof;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 2) goto LAB_007a20f9;
        uVar5 = CONCAT11(local_11[2],local_11[1]) << 8 | (ushort)local_11[2];
        if (-1 < (short)uVar5) {
          return (ulong)uVar5;
        }
      }
      else {
        if (local_11[0] != 0x4c) {
LAB_007a20cb:
          __e = length_must_be_integer;
          goto LAB_007a20f9;
        }
        uVar11 = 8;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 8) {
          uVar11 = (long)pbVar3 - (long)pbVar2;
        }
        if (pbVar3 == pbVar2) goto LAB_007a20c2;
        uVar9 = 0;
        pbVar10 = pbVar10 + uVar8;
        do {
          (this->source_).current_._M_current = pbVar10 + 1;
          local_11[uVar9 + 1] = *pbVar10;
          uVar9 = uVar9 + 1;
          pbVar10 = pbVar10 + 1;
        } while (uVar11 != uVar9);
        (this->source_).position_ = uVar11 + sVar7;
        __e = unexpected_eof;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 8) goto LAB_007a20f9;
        uVar6 = CONCAT22(uStack_e,CONCAT11(local_11[2],local_11[1]));
        uVar8 = (ulong)(uStack_c >> 0x18) | (((ulong)uStack_c & 0xff0000) << 0x20) >> 0x28 |
                (((ulong)uStack_c & 0xff00) << 0x20) >> 0x18 |
                (((ulong)uStack_c & 0xff) << 0x20) >> 8 | ((ulong)uVar6 & 0xff000000) << 8 |
                ((ulong)uVar6 & 0xff0000) << 0x18 | ((ulong)uVar6 & 0xff00) << 0x28 |
                CONCAT44(uStack_c,uVar6) << 0x38;
LAB_007a1fb0:
        if (-1 < (long)uVar8) {
          return uVar8;
        }
      }
LAB_007a20d5:
      __e = length_is_negative;
      goto LAB_007a20f9;
    }
    if (local_11[0] != 0x55) {
      if (local_11[0] == 0x6c) {
        uVar11 = 4;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 4) {
          uVar11 = (long)pbVar3 - (long)pbVar2;
        }
        if (pbVar3 == pbVar2) goto LAB_007a20c2;
        uVar9 = 0;
        pbVar10 = pbVar10 + uVar8;
        do {
          (this->source_).current_._M_current = pbVar10 + 1;
          local_11[uVar9 + 1] = *pbVar10;
          uVar9 = uVar9 + 1;
          pbVar10 = pbVar10 + 1;
        } while (uVar11 != uVar9);
        (this->source_).position_ = uVar11 + sVar7;
        __e = unexpected_eof;
        if ((ulong)((long)pbVar3 - (long)pbVar2) < 4) goto LAB_007a20f9;
        uVar6 = (uint)(uStack_e >> 8) | ((uStack_e & 0xff) << 0x10) >> 8 |
                (CONCAT11(local_11[2],local_11[1]) & 0xff00) << 8 |
                CONCAT22(uStack_e,CONCAT11(local_11[2],local_11[1])) << 0x18;
        if (-1 < (int)uVar6) {
          return (ulong)uVar6;
        }
        goto LAB_007a20d5;
      }
      if (local_11[0] != 0x69) goto LAB_007a20cb;
      uVar11 = (ulong)(pbVar3 != pbVar2);
      if (pbVar3 != pbVar2) {
        uVar9 = 0;
        pbVar10 = pbVar10 + uVar8;
        do {
          (this->source_).current_._M_current = pbVar10 + 1;
          local_11[uVar9 + 1] = *pbVar10;
          uVar9 = uVar9 + 1;
          pbVar10 = pbVar10 + 1;
        } while (uVar11 != uVar9);
        (this->source_).position_ = sVar7 + uVar11;
        uVar8 = (ulong)(char)local_11[1];
        goto LAB_007a1fb0;
      }
      (this->source_).position_ = sVar7 + uVar11;
LAB_007a20ef:
      __e = unexpected_eof;
      goto LAB_007a20f9;
    }
    uVar11 = (ulong)(pbVar3 != pbVar2);
    if (pbVar3 != pbVar2) {
      uVar9 = 0;
      pbVar10 = pbVar10 + uVar8;
      do {
        (this->source_).current_._M_current = pbVar10 + 1;
        local_11[uVar9 + 1] = *pbVar10;
        uVar9 = uVar9 + 1;
        pbVar10 = pbVar10 + 1;
      } while (uVar11 != uVar9);
      (this->source_).position_ = sVar7 + uVar11;
      return (ulong)local_11[1];
    }
    (this->source_).position_ = sVar7 + uVar11;
  }
  __e = unexpected_eof;
LAB_007a20f9:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return 0;
}

Assistant:

std::size_t get_length(std::error_code& ec)
    {
        std::size_t length = 0;
        uint8_t type;
        if (source_.read(&type, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return length;
        }
        switch (type)
        {
            case jsoncons::ubjson::ubjson_type::int8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int8_t val = binary::big_to_native<int8_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::uint8_type: 
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                length = b;
                break;
            }
            case jsoncons::ubjson::ubjson_type::int16_type: 
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int16_t val = binary::big_to_native<int16_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int32_t val = binary::big_to_native<int32_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = static_cast<std::size_t>(val);
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)];
                if (source_.read(buf, sizeof(int64_t)) != sizeof(int64_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int64_t val = binary::big_to_native<int64_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = (std::size_t)val;
                    if (length != (uint64_t)val)
                    {
                        ec = ubjson_errc::number_too_large;
                        more_ = false;
                        return length;
                    }
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            default:
            {
                ec = ubjson_errc::length_must_be_integer;
                more_ = false;
                return length;
            }
        }
        return length;
    }